

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

bool __thiscall
slang::ast::detail::ClassSpecializationKey::operator==
          (ClassSpecializationKey *this,ClassSpecializationKey *other)

{
  Type *pTVar1;
  bool bVar2;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *this_00;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *psVar3;
  ConstantValue *lhs;
  ConstantValue *pCVar4;
  reference ppCVar5;
  reference ppTVar6;
  long in_RSI;
  long in_RDI;
  Type *in_stack_00000010;
  Type *in_stack_00000018;
  Type *r_1;
  Type *l_1;
  iterator rit_1;
  iterator lit_1;
  ConstantValue *r;
  ConstantValue *l;
  iterator rit;
  iterator lit;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *in_stack_ffffffffffffff58;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  local_60;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  local_58;
  ConstantValue **local_50;
  ConstantValue **local_48;
  ConstantValue *local_40;
  ConstantValue *local_38;
  ConstantValue **local_30;
  __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
  local_28;
  __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
  local_20 [4];
  
  if (*(long *)(in_RDI + 0x20) == *(long *)(in_RSI + 0x20)) {
    this_00 = (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
              std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::size
                        ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)0x6bfd90
                        );
    psVar3 = (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
             std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::size
                       ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)0x6bfda2)
    ;
    if (this_00 == psVar3) {
      lhs = (ConstantValue *)
            std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)0x6bfdbd);
      pCVar4 = (ConstantValue *)
               std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::size
                         ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)0x6bfdd3);
      if (lhs == pCVar4) {
        local_20[0]._M_current =
             (ConstantValue **)
             std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff58);
        local_28._M_current =
             (ConstantValue **)
             std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff58);
        do {
          local_30 = (ConstantValue **)
                     std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::end
                               ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)
                                this_00);
          bVar2 = __gnu_cxx::
                  operator==<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                            ((__normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                              *)lhs,(__normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                                     *)in_stack_ffffffffffffff58);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_58._M_current =
                 (Type **)std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                                    (in_stack_ffffffffffffff58);
            local_60._M_current =
                 (Type **)std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                                    (in_stack_ffffffffffffff58);
            do {
              std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::end(this_00);
              bVar2 = __gnu_cxx::
                      operator==<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                                ((__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                                  *)lhs,(__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                                         *)in_stack_ffffffffffffff58);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                return true;
              }
              ppTVar6 = __gnu_cxx::
                        __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                        ::operator*(&local_58);
              pTVar1 = *ppTVar6;
              ppTVar6 = __gnu_cxx::
                        __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                        ::operator*(&local_60);
              if ((pTVar1 == (Type *)0x0) || (*ppTVar6 == (Type *)0x0)) {
                if (pTVar1 != *ppTVar6) {
                  return false;
                }
              }
              else {
                bVar2 = Type::isMatching(in_stack_00000018,in_stack_00000010);
                if (!bVar2) {
                  return false;
                }
              }
              __gnu_cxx::
              __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
              ::operator++((__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                            *)this_00,(int)((ulong)lhs >> 0x20));
              __gnu_cxx::
              __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
              ::operator++((__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                            *)this_00,(int)((ulong)lhs >> 0x20));
            } while( true );
          }
          ppCVar5 = __gnu_cxx::
                    __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                    ::operator*(local_20);
          local_38 = *ppCVar5;
          ppCVar5 = __gnu_cxx::
                    __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                    ::operator*(&local_28);
          local_40 = *ppCVar5;
          if ((local_38 == (ConstantValue *)0x0) || (local_40 == (ConstantValue *)0x0)) {
            if (local_38 != local_40) {
              return false;
            }
          }
          else {
            bVar2 = slang::operator==(lhs,(ConstantValue *)in_stack_ffffffffffffff58);
            if (!bVar2) {
              return false;
            }
          }
          local_48 = (ConstantValue **)
                     __gnu_cxx::
                     __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                     ::operator++((__normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                                   *)this_00,(int)((ulong)lhs >> 0x20));
          local_50 = (ConstantValue **)
                     __gnu_cxx::
                     __normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                     ::operator++((__normal_iterator<const_slang::ConstantValue_*const_*,_std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>_>
                                   *)this_00,(int)((ulong)lhs >> 0x20));
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool ClassSpecializationKey::operator==(const ClassSpecializationKey& other) const {
    if (savedHash != other.savedHash || paramValues.size() != other.paramValues.size() ||
        typeParams.size() != other.typeParams.size()) {
        return false;
    }

    for (auto lit = paramValues.begin(), rit = other.paramValues.begin(); lit != paramValues.end();
         lit++, rit++) {
        const ConstantValue* l = *lit;
        const ConstantValue* r = *rit;
        if (l && r) {
            if (!(*l == *r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    for (auto lit = typeParams.begin(), rit = other.typeParams.begin(); lit != typeParams.end();
         lit++, rit++) {
        const Type* l = *lit;
        const Type* r = *rit;
        if (l && r) {
            if (!l->isMatching(*r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    return true;
}